

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ts_generator.cc
# Opt level: O0

void grpc_ts_generator::anon_unknown_1::GenerateClientWriteStreamInterface
               (Printer *printer,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *dictonary)

{
  undefined8 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> options;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> meta_data;
  undefined1 local_a0 [8];
  string callback;
  allocator<char> local_69;
  undefined1 local_68 [8];
  string main;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *dictonary_local;
  Printer *printer_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)((long)&main.field_2 + 8),dictonary);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_68,"$ISPUBLIC$$MethodName$(",&local_69);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,
             "callback: (error: grpc.ServiceError | null, response: $INPUT$) => void): grpc.ClientWritableStream<$OUTPUT$>;\n"
             ,(allocator<char> *)(meta_data.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(meta_data.field_2._M_local_buf + 0xf));
  (anonymous_namespace)::GenerateMetaData_abi_cxx11_();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&options.field_2 + 8),", ");
  std::__cxx11::string::~string((string *)(options.field_2._M_local_buf + 8));
  (anonymous_namespace)::GenerateOptions_abi_cxx11_();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                 &local_128,", ");
  std::__cxx11::string::~string((string *)&local_128);
  std::operator+(&local_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  uVar1 = std::__cxx11::string::c_str();
  (*printer->_vptr_Printer[2])(printer,(undefined1 *)((long)&main.field_2 + 8),uVar1);
  std::__cxx11::string::~string((string *)&local_148);
  std::operator+(&local_188,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
  std::operator+(&local_168,&local_188,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  uVar1 = std::__cxx11::string::c_str();
  (*printer->_vptr_Printer[2])(printer,(undefined1 *)((long)&main.field_2 + 8),uVar1);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::operator+(&local_1c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
  std::operator+(&local_1a8,&local_1c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  uVar1 = std::__cxx11::string::c_str();
  (*printer->_vptr_Printer[2])(printer,(undefined1 *)((long)&main.field_2 + 8),uVar1);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::operator+(&local_228,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
  std::operator+(&local_208,&local_228,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
  std::operator+(&local_1e8,&local_208,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  uVar1 = std::__cxx11::string::c_str();
  (*printer->_vptr_Printer[2])(printer,(undefined1 *)((long)&main.field_2 + 8),uVar1);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_68);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)((long)&main.field_2 + 8));
  return;
}

Assistant:

static void GenerateClientWriteStreamInterface(
    grpc_generator::Printer *printer,
    std::map<grpc::string, grpc::string> *dictonary) {
  auto vars = *dictonary;
  grpc::string main = "$ISPUBLIC$$MethodName$(";
  grpc::string callback =
      "callback: (error: grpc.ServiceError | null, response: "
      "$INPUT$) => void): "
      "grpc.ClientWritableStream<$OUTPUT$>;\n";
  auto meta_data = GenerateMetaData() + ", ";
  auto options = GenerateOptions() + ", ";
  printer->Print(vars, (main + callback).c_str());
  printer->Print(vars, (main + meta_data + callback).c_str());
  printer->Print(vars, (main + options + callback).c_str());
  printer->Print(vars, (main + meta_data + options + callback).c_str());
}